

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O2

void free_FMFormatList(FMFormatList format_list)

{
  for (; format_list->format_name != (char *)0x0; format_list = format_list + 1) {
    free(format_list->format_name);
    free_field_list(format_list->field_list);
    free(format_list->opt_info);
  }
  return;
}

Assistant:

extern void
free_FMFormatList(FMFormatList format_list)
{
    int i = 0;
    while(format_list[i].format_name){
	free((char*)format_list[i].format_name);
	free_field_list(format_list[i].field_list);
	if (format_list[i].opt_info) free(format_list[i].opt_info);
	i++;
    }
}